

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O3

ScalarFunction * __thiscall
duckdb::FunctionSerializer::
DeserializeFunction<duckdb::ScalarFunction,duckdb::ScalarFunctionCatalogEntry>
          (ScalarFunction *__return_storage_ptr__,FunctionSerializer *this,ClientContext *context,
          CatalogType catalog_type,string *name,vector<duckdb::LogicalType,_true> *arguments,
          vector<duckdb::LogicalType,_true> *original_arguments)

{
  pointer pcVar1;
  pointer pLVar2;
  pointer pLVar3;
  CatalogEntry *pCVar4;
  InternalException *this_00;
  undefined7 in_register_00000009;
  string *arguments_00;
  EntryLookupInfo lookup_info;
  string local_b8;
  string *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  EntryLookupInfo local_50;
  
  local_98 = (string *)CONCAT71(in_register_00000009,catalog_type);
  EntryLookupInfo::EntryLookupInfo
            (&local_50,(CatalogType)context,local_98,(QueryErrorContext)0xffffffffffffffff);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"system","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"main","");
  pCVar4 = Catalog::GetEntry((ClientContext *)this,&local_b8,&local_90,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (pCVar4->type == (CatalogType)context) {
    arguments_00 = (string *)arguments;
    if ((arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      arguments_00 = name;
    }
    ScalarFunctionSet::GetFunctionByArguments
              (__return_storage_ptr__,(ScalarFunctionSet *)&pCVar4[1].comment.value_info_,
               (ClientContext *)this,(vector<duckdb::LogicalType,_true> *)arguments_00);
    local_b8.field_2._M_allocated_capacity =
         (size_type)
         *(pointer *)
          ((long)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data + 0x10);
    pLVar2 = (pointer)(name->_M_dataplus)._M_p;
    pLVar3 = (pointer)name->_M_string_length;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.arguments.
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data + 0x10) = (pointer)(name->field_2)._M_allocated_capacity;
    local_b8._M_dataplus._M_p =
         (pointer)(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_b8._M_string_length =
         *(size_type *)
          ((long)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data + 8);
    (__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.arguments.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = pLVar2;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.arguments.
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data + 8) = pLVar3;
    (name->field_2)._M_allocated_capacity = 0;
    (name->_M_dataplus)._M_p = (pointer)0x0;
    name->_M_string_length = 0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_b8);
    local_b8.field_2._M_allocated_capacity =
         (size_type)
         *(pointer *)
          ((long)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                  original_arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data + 0x10);
    pLVar2 = (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar3 = (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
             original_arguments.
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data + 0x10) =
         (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_b8._M_dataplus._M_p =
         (pointer)(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                  original_arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_b8._M_string_length =
         *(size_type *)
          ((long)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                  original_arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data + 8);
    (__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.original_arguments.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = pLVar2;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
             original_arguments.
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data + 8) = pLVar3;
    (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_b8);
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"DeserializeFunction - cant find catalog entry for function %s","")
  ;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (local_98->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + local_98->_M_string_length);
  InternalException::InternalException<std::__cxx11::string>(this_00,&local_b8,&local_70);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static FUNC DeserializeFunction(ClientContext &context, CatalogType catalog_type, const string &name,
	                                vector<LogicalType> arguments, vector<LogicalType> original_arguments) {
		EntryLookupInfo lookup_info(catalog_type, name);
		auto &func_catalog = Catalog::GetEntry(context, SYSTEM_CATALOG, DEFAULT_SCHEMA, lookup_info);
		if (func_catalog.type != catalog_type) {
			throw InternalException("DeserializeFunction - cant find catalog entry for function %s", name);
		}
		auto &functions = func_catalog.Cast<CATALOG_ENTRY>();
		auto function = functions.functions.GetFunctionByArguments(
		    context, original_arguments.empty() ? arguments : original_arguments);
		function.arguments = std::move(arguments);
		function.original_arguments = std::move(original_arguments);
		return function;
	}